

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O1

int add_base128_integer(CBB *cbb,uint64_t v)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  
  iVar5 = 0;
  uVar4 = v;
  if (v != 0) {
    do {
      iVar5 = iVar5 + 1;
      bVar1 = 0x7f < uVar4;
      uVar4 = uVar4 >> 7;
    } while (bVar1);
  }
  uVar6 = iVar5 + (uint)(iVar5 == 0);
  iVar5 = uVar6 * 7;
  uVar2 = uVar6;
  do {
    uVar2 = uVar2 - 1;
    iVar5 = iVar5 + -7;
    if (uVar6 <= uVar2) break;
    iVar3 = cbb_add_u(cbb,(ulong)((uint)(uVar2 != 0) << 7 | (uint)(v >> ((byte)iVar5 & 0x3f)) & 0x7f
                                 ),1);
  } while (iVar3 != 0);
  return (int)(uVar6 <= uVar2);
}

Assistant:

static int add_base128_integer(CBB *cbb, uint64_t v) {
  unsigned len_len = 0;
  uint64_t copy = v;
  while (copy > 0) {
    len_len++;
    copy >>= 7;
  }
  if (len_len == 0) {
    len_len = 1;  // Zero is encoded with one byte.
  }
  for (unsigned i = len_len - 1; i < len_len; i--) {
    uint8_t byte = (v >> (7 * i)) & 0x7f;
    if (i != 0) {
      // The high bit denotes whether there is more data.
      byte |= 0x80;
    }
    if (!CBB_add_u8(cbb, byte)) {
      return 0;
    }
  }
  return 1;
}